

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd.c
# Opt level: O0

void ZSTD_initCCtx(ZSTD_CCtx *cctx,ZSTD_customMem memManager)

{
  int iVar1;
  uint uVar2;
  void *in_RDI;
  size_t err;
  ZSTD_CCtx *cctx_00;
  
  cctx_00 = (ZSTD_CCtx *)&err;
  if (in_RDI == (void *)0x0) {
    __assert_fail("cctx != NULL",
                  "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                  ,0x5120,"void ZSTD_initCCtx(ZSTD_CCtx *, ZSTD_customMem)");
  }
  memset(in_RDI,0,0x1478);
  *(size_t *)((long)in_RDI + 0x350) = *(size_t *)cctx_00;
  *(undefined8 *)((long)in_RDI + 0x358) = *(undefined8 *)&cctx_00->bmi2;
  *(undefined8 *)((long)in_RDI + 0x360) = *(undefined8 *)&cctx_00->requestedParams;
  iVar1 = ZSTD_cpuSupportsBmi2();
  *(int *)((long)in_RDI + 8) = iVar1;
  ZSTD_CCtx_reset(cctx_00,0);
  uVar2 = ZSTD_isError(0x1e3bf2);
  if (uVar2 == 0) {
    return;
  }
  __assert_fail("!ZSTD_isError(err)",
                "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                ,0x5125,"void ZSTD_initCCtx(ZSTD_CCtx *, ZSTD_customMem)");
}

Assistant:

static void ZSTD_initCCtx(ZSTD_CCtx* cctx, ZSTD_customMem memManager)
{
    assert(cctx != NULL);
    ZSTD_memset(cctx, 0, sizeof(*cctx));
    cctx->customMem = memManager;
    cctx->bmi2 = ZSTD_cpuSupportsBmi2();
    {   size_t const err = ZSTD_CCtx_reset(cctx, ZSTD_reset_parameters);
        assert(!ZSTD_isError(err));
        (void)err;
    }
}